

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

int __thiscall cmCursesMainForm::Configure(cmCursesMainForm *this,int noconfigure)

{
  cmake *pcVar1;
  bool bVar2;
  uint uVar3;
  string *path;
  cmCursesLongMessageForm *this_00;
  ulong uVar4;
  ulong uVar5;
  char *title;
  uint uVar6;
  uint uVar7;
  string local_98;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  ResetOutputs(this);
  if (noconfigure == 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Configuring","");
    UpdateProgress(this,&local_98,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesMainForm.cxx:468:7)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesMainForm.cxx:468:7)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    cmake::SetProgressCallback
              ((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
               _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl,(ProgressCallbackType *)&local_58)
    ;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  FillCacheManagerFromUI(this);
  pcVar1 = (this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t
           .super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  path = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar1);
  cmake::SaveCache(pcVar1,path);
  LoadCache(this,(char *)path);
  this->OkToGenerate = true;
  pcVar1 = (this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t
           .super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  if (noconfigure == 0) {
    uVar3 = cmake::Configure(pcVar1);
  }
  else {
    uVar3 = cmake::DoPreConfigureChecks(pcVar1);
    this->OkToGenerate = false;
    uVar3 = (int)uVar3 >> 0x1f & uVar3;
  }
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  cmake::SetProgressCallback
            ((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl,(ProgressCallbackType *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  keypad(_stdscr,1);
  if ((uVar3 != 0) || (this->HasNonStatusOutputs == true)) {
    if ((cmSystemTools::s_ErrorOccurred != false) ||
       ((cmSystemTools::s_FatalErrorOccurred != false ||
        (bVar2 = cmSystemTools::GetInterruptFlag(), bVar2)))) {
      this->OkToGenerate = false;
    }
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
    if (_stdscr != 0) {
      uVar7 = (int)*(short *)(_stdscr + 4) + 1;
      uVar6 = (int)*(short *)(_stdscr + 6) + 1;
    }
    title = "Configure failed with the following output";
    if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false))
    {
      bVar2 = cmSystemTools::GetInterruptFlag();
      title = "Configure produced the following output";
      if (bVar2) {
        title = "Configure failed with the following output";
      }
    }
    this_00 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Outputs,title,ScrollDown);
    cmSystemTools::s_FatalErrorOccurred = false;
    cmSystemTools::s_ErrorOccurred = false;
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])(this_00,1,1,(ulong)uVar6,(ulong)uVar7);
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[2])(this_00);
    if (uVar3 == 0xfffffffe) {
      return -2;
    }
  }
  InitializeUI(this);
  uVar4 = 0xffffffff;
  uVar5 = 0xffffffff;
  if (_stdscr != 0) {
    uVar5 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
    uVar4 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
  }
  cmCursesForm::CurrentForm = &this->super_cmCursesForm;
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar4,uVar5);
  return 0;
}

Assistant:

int cmCursesMainForm::Configure(int noconfigure)
{
  this->ResetOutputs();

  if (noconfigure == 0) {
    this->UpdateProgress("Configuring", 0);
    this->CMakeInstance->SetProgressCallback(
      [this](const std::string& msg, float prog) {
        this->UpdateProgress(msg, prog);
      });
  }

  // always save the current gui values to disk
  this->FillCacheManagerFromUI();
  this->CMakeInstance->SaveCache(
    this->CMakeInstance->GetHomeOutputDirectory());
  this->LoadCache(nullptr);

  // run the generate process
  this->OkToGenerate = true;
  int retVal;
  if (noconfigure) {
    retVal = this->CMakeInstance->DoPreConfigureChecks();
    this->OkToGenerate = false;
    if (retVal > 0) {
      retVal = 0;
    }
  } else {
    retVal = this->CMakeInstance->Configure();
  }
  this->CMakeInstance->SetProgressCallback(nullptr);

  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  if (retVal != 0 || this->HasNonStatusOutputs) {
    // see if there was an error
    if (cmSystemTools::GetErrorOccurredFlag()) {
      this->OkToGenerate = false;
    }
    int xx;
    int yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Configure produced the following output";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      title = "Configure failed with the following output";
    }
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Outputs, title,
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    // reset error condition
    cmSystemTools::ResetErrorOccurredFlag();
    CurrentForm = msgs;
    msgs->Render(1, 1, xx, yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if (retVal == -2) {
      return retVal;
    }
  }

  this->InitializeUI();
  CurrentForm = this;
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);
  this->Render(1, 1, xi, yi);

  return 0;
}